

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reverb.cpp
# Opt level: O0

void anon_unknown.dwarf_15ef52::StdReverb_getParamf(EffectProps *props,ALenum param,float *val)

{
  effect_exception *this;
  undefined4 *in_RDX;
  uint in_ESI;
  undefined4 *in_RDI;
  
  switch(in_ESI) {
  case 1:
    *in_RDX = *in_RDI;
    break;
  case 2:
    *in_RDX = in_RDI[1];
    break;
  case 3:
    *in_RDX = in_RDI[2];
    break;
  case 4:
    *in_RDX = in_RDI[3];
    break;
  case 5:
    *in_RDX = in_RDI[4];
    break;
  case 6:
    *in_RDX = in_RDI[5];
    break;
  case 7:
    *in_RDX = in_RDI[6];
    break;
  case 8:
    *in_RDX = in_RDI[7];
    break;
  case 9:
    *in_RDX = in_RDI[8];
    break;
  case 10:
    *in_RDX = in_RDI[9];
    break;
  case 0xb:
    *in_RDX = in_RDI[10];
    break;
  case 0xc:
    *in_RDX = in_RDI[0xb];
    break;
  default:
    this = (effect_exception *)__cxa_allocate_exception(0x30);
    effect_exception::effect_exception
              (this,0xa002,"Invalid reverb float property 0x%04x",(ulong)in_ESI);
    __cxa_throw(this,&effect_exception::typeinfo,effect_exception::~effect_exception);
  }
  return;
}

Assistant:

void StdReverb_getParamf(const EffectProps *props, ALenum param, float *val)
{
    switch(param)
    {
    case AL_REVERB_DENSITY:
        *val = props->Reverb.Density;
        break;

    case AL_REVERB_DIFFUSION:
        *val = props->Reverb.Diffusion;
        break;

    case AL_REVERB_GAIN:
        *val = props->Reverb.Gain;
        break;

    case AL_REVERB_GAINHF:
        *val = props->Reverb.GainHF;
        break;

    case AL_REVERB_DECAY_TIME:
        *val = props->Reverb.DecayTime;
        break;

    case AL_REVERB_DECAY_HFRATIO:
        *val = props->Reverb.DecayHFRatio;
        break;

    case AL_REVERB_REFLECTIONS_GAIN:
        *val = props->Reverb.ReflectionsGain;
        break;

    case AL_REVERB_REFLECTIONS_DELAY:
        *val = props->Reverb.ReflectionsDelay;
        break;

    case AL_REVERB_LATE_REVERB_GAIN:
        *val = props->Reverb.LateReverbGain;
        break;

    case AL_REVERB_LATE_REVERB_DELAY:
        *val = props->Reverb.LateReverbDelay;
        break;

    case AL_REVERB_AIR_ABSORPTION_GAINHF:
        *val = props->Reverb.AirAbsorptionGainHF;
        break;

    case AL_REVERB_ROOM_ROLLOFF_FACTOR:
        *val = props->Reverb.RoomRolloffFactor;
        break;

    default:
        throw effect_exception{AL_INVALID_ENUM, "Invalid reverb float property 0x%04x", param};
    }
}